

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O1

Operator *
Operator::unary(Operator *__return_storage_ptr__,OperatorChar op,int precedence,
               OperatorAssociativity associativity,UnaryOperatorFn *applyFn)

{
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  _Any_data local_40;
  _Manager_type local_30;
  
  local_58 = (code *)0x0;
  uStack_50 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  std::function<ResultValue_(ResultValue)>::function
            ((function<ResultValue_(ResultValue)> *)&local_40,applyFn);
  Operator(__return_storage_ptr__,op,precedence,associativity,true,(BinaryOperatorFn *)&local_68,
           (UnaryOperatorFn *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

Operator Operator::unary(OperatorChar op, int precedence, OperatorAssociativity associativity, UnaryOperatorFn applyFn) {
	return Operator(op, precedence, associativity, true, {}, applyFn);
}